

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlChar * xmlParseEncodingDecl(xmlParserCtxtPtr ctxt)

{
  int iVar1;
  xmlCharEncodingHandlerPtr handler_00;
  xmlCharEncodingHandlerPtr handler;
  xmlChar *encoding;
  xmlParserCtxtPtr ctxt_local;
  
  handler = (xmlCharEncodingHandlerPtr)0x0;
  xmlSkipBlankChars(ctxt);
  if ((((*ctxt->input->cur == 'e') && (ctxt->input->cur[1] == 'n')) && (ctxt->input->cur[2] == 'c'))
     && (((ctxt->input->cur[3] == 'o' && (ctxt->input->cur[4] == 'd')) &&
         ((ctxt->input->cur[5] == 'i' &&
          ((ctxt->input->cur[6] == 'n' && (ctxt->input->cur[7] == 'g')))))))) {
    ctxt->input->cur = ctxt->input->cur + 8;
    ctxt->input->col = ctxt->input->col + 8;
    if (*ctxt->input->cur == '\0') {
      xmlParserInputGrow(ctxt->input,0xfa);
    }
    xmlSkipBlankChars(ctxt);
    if (*ctxt->input->cur != '=') {
      xmlFatalErr(ctxt,XML_ERR_EQUAL_REQUIRED,(char *)0x0);
      return (xmlChar *)0x0;
    }
    xmlNextChar(ctxt);
    xmlSkipBlankChars(ctxt);
    if (*ctxt->input->cur == '\"') {
      xmlNextChar(ctxt);
      handler = (xmlCharEncodingHandlerPtr)xmlParseEncName(ctxt);
      if (*ctxt->input->cur != '\"') {
        xmlFatalErr(ctxt,XML_ERR_STRING_NOT_CLOSED,(char *)0x0);
        (*xmlFree)(handler);
        return (xmlChar *)0x0;
      }
      xmlNextChar(ctxt);
    }
    else if (*ctxt->input->cur == '\'') {
      xmlNextChar(ctxt);
      handler = (xmlCharEncodingHandlerPtr)xmlParseEncName(ctxt);
      if (*ctxt->input->cur != '\'') {
        xmlFatalErr(ctxt,XML_ERR_STRING_NOT_CLOSED,(char *)0x0);
        (*xmlFree)(handler);
        return (xmlChar *)0x0;
      }
      xmlNextChar(ctxt);
    }
    else {
      xmlFatalErr(ctxt,XML_ERR_STRING_NOT_STARTED,(char *)0x0);
    }
    if ((ctxt->options & 0x200000U) != 0) {
      (*xmlFree)(handler);
      return (xmlChar *)0x0;
    }
    if ((handler == (xmlCharEncodingHandlerPtr)0x0) ||
       ((iVar1 = xmlStrcasecmp((xmlChar *)handler,(xmlChar *)"UTF-16"), iVar1 != 0 &&
        (iVar1 = xmlStrcasecmp((xmlChar *)handler,(xmlChar *)"UTF16"), iVar1 != 0)))) {
      if ((handler == (xmlCharEncodingHandlerPtr)0x0) ||
         ((iVar1 = xmlStrcasecmp((xmlChar *)handler,"UTF-8"), iVar1 != 0 &&
          (iVar1 = xmlStrcasecmp((xmlChar *)handler,(xmlChar *)"UTF8"), iVar1 != 0)))) {
        if (handler != (xmlCharEncodingHandlerPtr)0x0) {
          if (ctxt->input->encoding != (xmlChar *)0x0) {
            (*xmlFree)(ctxt->input->encoding);
          }
          ctxt->input->encoding = (xmlChar *)handler;
          handler_00 = xmlFindCharEncodingHandler((char *)handler);
          if (handler_00 == (xmlCharEncodingHandlerPtr)0x0) {
            xmlFatalErrMsgStr(ctxt,XML_ERR_UNSUPPORTED_ENCODING,"Unsupported encoding %s\n",
                              (xmlChar *)handler);
            return (xmlChar *)0x0;
          }
          iVar1 = xmlSwitchToEncoding(ctxt,handler_00);
          if (iVar1 < 0) {
            ctxt->errNo = 0x20;
            return (xmlChar *)0x0;
          }
        }
      }
      else {
        if (ctxt->encoding != (xmlChar *)0x0) {
          (*xmlFree)(ctxt->encoding);
        }
        ctxt->encoding = (xmlChar *)handler;
      }
    }
    else {
      if (((ctxt->encoding == (xmlChar *)0x0) && (ctxt->input->buf != (xmlParserInputBufferPtr)0x0))
         && (ctxt->input->buf->encoder == (xmlCharEncodingHandlerPtr)0x0)) {
        xmlFatalErrMsg(ctxt,XML_ERR_INVALID_ENCODING,
                       "Document labelled UTF-16 but has UTF-8 content\n");
      }
      if (ctxt->encoding != (xmlChar *)0x0) {
        (*xmlFree)(ctxt->encoding);
      }
      ctxt->encoding = (xmlChar *)handler;
    }
  }
  return (xmlChar *)handler;
}

Assistant:

const xmlChar *
xmlParseEncodingDecl(xmlParserCtxtPtr ctxt) {
    xmlChar *encoding = NULL;

    SKIP_BLANKS;
    if (CMP8(CUR_PTR, 'e', 'n', 'c', 'o', 'd', 'i', 'n', 'g')) {
	SKIP(8);
	SKIP_BLANKS;
	if (RAW != '=') {
	    xmlFatalErr(ctxt, XML_ERR_EQUAL_REQUIRED, NULL);
	    return(NULL);
        }
	NEXT;
	SKIP_BLANKS;
	if (RAW == '"') {
	    NEXT;
	    encoding = xmlParseEncName(ctxt);
	    if (RAW != '"') {
		xmlFatalErr(ctxt, XML_ERR_STRING_NOT_CLOSED, NULL);
		xmlFree((xmlChar *) encoding);
		return(NULL);
	    } else
	        NEXT;
	} else if (RAW == '\''){
	    NEXT;
	    encoding = xmlParseEncName(ctxt);
	    if (RAW != '\'') {
		xmlFatalErr(ctxt, XML_ERR_STRING_NOT_CLOSED, NULL);
		xmlFree((xmlChar *) encoding);
		return(NULL);
	    } else
	        NEXT;
	} else {
	    xmlFatalErr(ctxt, XML_ERR_STRING_NOT_STARTED, NULL);
	}

        /*
         * Non standard parsing, allowing the user to ignore encoding
         */
        if (ctxt->options & XML_PARSE_IGNORE_ENC) {
	    xmlFree((xmlChar *) encoding);
            return(NULL);
	}

	/*
	 * UTF-16 encoding switch has already taken place at this stage,
	 * more over the little-endian/big-endian selection is already done
	 */
        if ((encoding != NULL) &&
	    ((!xmlStrcasecmp(encoding, BAD_CAST "UTF-16")) ||
	     (!xmlStrcasecmp(encoding, BAD_CAST "UTF16")))) {
	    /*
	     * If no encoding was passed to the parser, that we are
	     * using UTF-16 and no decoder is present i.e. the
	     * document is apparently UTF-8 compatible, then raise an
	     * encoding mismatch fatal error
	     */
	    if ((ctxt->encoding == NULL) &&
	        (ctxt->input->buf != NULL) &&
	        (ctxt->input->buf->encoder == NULL)) {
		xmlFatalErrMsg(ctxt, XML_ERR_INVALID_ENCODING,
		  "Document labelled UTF-16 but has UTF-8 content\n");
	    }
	    if (ctxt->encoding != NULL)
		xmlFree((xmlChar *) ctxt->encoding);
	    ctxt->encoding = encoding;
	}
	/*
	 * UTF-8 encoding is handled natively
	 */
        else if ((encoding != NULL) &&
	    ((!xmlStrcasecmp(encoding, BAD_CAST "UTF-8")) ||
	     (!xmlStrcasecmp(encoding, BAD_CAST "UTF8")))) {
	    if (ctxt->encoding != NULL)
		xmlFree((xmlChar *) ctxt->encoding);
	    ctxt->encoding = encoding;
	}
	else if (encoding != NULL) {
	    xmlCharEncodingHandlerPtr handler;

	    if (ctxt->input->encoding != NULL)
		xmlFree((xmlChar *) ctxt->input->encoding);
	    ctxt->input->encoding = encoding;

            handler = xmlFindCharEncodingHandler((const char *) encoding);
	    if (handler != NULL) {
		if (xmlSwitchToEncoding(ctxt, handler) < 0) {
		    /* failed to convert */
		    ctxt->errNo = XML_ERR_UNSUPPORTED_ENCODING;
		    return(NULL);
		}
	    } else {
		xmlFatalErrMsgStr(ctxt, XML_ERR_UNSUPPORTED_ENCODING,
			"Unsupported encoding %s\n", encoding);
		return(NULL);
	    }
	}
    }
    return(encoding);
}